

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

String * __thiscall String::operator=(String *this,String *other)

{
  usize *puVar1;
  Data *pDVar2;
  usize uVar3;
  Data *pDVar4;
  ulong uVar5;
  
  pDVar2 = other->data;
  if (pDVar2->ref == 0) {
    if (this->data->ref != 0) {
      LOCK();
      puVar1 = &this->data->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (this->data != (Data *)0x0)) {
        operator_delete__(this->data);
      }
    }
    uVar5 = pDVar2->len | 3;
    pDVar4 = (Data *)operator_new__(uVar5 + 0x21);
    this->data = pDVar4;
    pDVar4->str = (char *)(pDVar4 + 1);
    Memory::copy((Memory *)(pDVar4 + 1),(EVP_PKEY_CTX *)pDVar2->str,(EVP_PKEY_CTX *)pDVar2->len);
    pDVar4 = this->data;
    uVar3 = pDVar2->len;
    pDVar4->len = uVar3;
    pDVar4->str[uVar3] = '\0';
    pDVar2 = this->data;
    pDVar2->ref = 1;
    pDVar2->capacity = uVar5;
  }
  else {
    LOCK();
    pDVar2->ref = pDVar2->ref + 1;
    UNLOCK();
    if (this->data->ref != 0) {
      LOCK();
      puVar1 = &this->data->ref;
      *puVar1 = *puVar1 - 1;
      UNLOCK();
      if ((*puVar1 == 0) && (this->data != (Data *)0x0)) {
        operator_delete__(this->data);
      }
    }
    this->data = pDVar2;
  }
  return this;
}

Assistant:

String& operator=(const String& other)
  {
    Data* otherData = other.data;
    if(otherData->ref)
    {
      Atomic::increment(otherData->ref);
      if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;
      data = otherData;
    }
    else
    {
      if(data->ref && Atomic::decrement(data->ref) == 0)
        delete[] (char*)data;
      usize capacity = otherData->len | 0x3;
      data = (Data*)new char[(capacity + 1) * sizeof(char) + sizeof(Data)];
      data->str = (char*)((byte*)data + sizeof(Data));
      Memory::copy((char*)data->str, otherData->str, otherData->len * sizeof(char));
      ((char*)data->str)[data->len = otherData->len] = '\0';
      data->ref = 1;
      data->capacity = capacity;
    }
    return *this;
  }